

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O1

void mon_catchup_elapsed_time(monst *mtmp,long nmv)

{
  byte bVar1;
  uint uVar2;
  uchar uVar3;
  int iVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  lVar8 = 0x7ffe;
  if (nmv < 0x7ffe) {
    lVar8 = nmv;
  }
  bVar1 = mtmp->mblinded;
  cVar5 = (char)lVar8;
  iVar7 = (int)lVar8;
  if (bVar1 != 0) {
    uVar3 = '\x01';
    if (iVar7 < (int)(uint)bVar1) {
      uVar3 = bVar1 - cVar5;
    }
    mtmp->mblinded = uVar3;
  }
  bVar1 = mtmp->mfrozen;
  if (bVar1 != 0) {
    uVar3 = '\x01';
    if (iVar7 < (int)(uint)bVar1) {
      uVar3 = bVar1 - cVar5;
    }
    mtmp->mfrozen = uVar3;
  }
  bVar1 = mtmp->mfleetim;
  if (bVar1 != 0) {
    uVar3 = '\x01';
    if (iVar7 < (int)(uint)bVar1) {
      uVar3 = bVar1 - cVar5;
    }
    mtmp->mfleetim = uVar3;
  }
  if (((mtmp->field_0x62 & 0x80) != 0) &&
     (uVar2 = mt_random(),
     0x14 < SUB164(ZEXT416(uVar2) % SEXT816((lVar8 << 0x20) + 0x100000000 >> 0x20),0))) {
    mtmp->field_0x62 = mtmp->field_0x62 & 0x7f;
  }
  if (((mtmp->field_0x62 & 0x20) != 0) &&
     (uVar2 = mt_random(),
     0x19 < SUB164(ZEXT416(uVar2) % SEXT816((lVar8 << 0x20) + 0x100000000 >> 0x20),0))) {
    mtmp->field_0x62 = mtmp->field_0x62 & 0xdf;
  }
  if (((mtmp->field_0x62 & 0x10) != 0) &&
     (uVar2 = mt_random(),
     5 < SUB164(ZEXT416(uVar2) % SEXT816((lVar8 << 0x20) + 0x100000000 >> 0x20),0))) {
    mtmp->field_0x62 = mtmp->field_0x62 & 0xef;
  }
  iVar6 = mtmp->meating - iVar7;
  if (mtmp->meating < iVar7) {
    iVar6 = 0;
  }
  iVar4 = mtmp->mspec_used - iVar7;
  if (mtmp->mspec_used < iVar7) {
    iVar4 = 0;
  }
  mtmp->meating = iVar6;
  mtmp->mspec_used = iVar4;
  iVar6 = (int)mtmp->mtame;
  if (iVar6 != 0) {
    iVar4 = (iVar7 + 0x4b) / 0x96;
    if (iVar4 < iVar6) {
      cVar5 = mtmp->mtame - (char)iVar4;
    }
    else {
      uVar2 = mt_random();
      cVar5 = '\0';
      if (iVar6 <= SUB164(ZEXT416(uVar2) % SEXT816((long)iVar4),0)) {
        mtmp->field_0x62 = mtmp->field_0x62 & 0xbf;
        cVar5 = '\0';
      }
    }
    mtmp->mtame = cVar5;
  }
  if (((mtmp->mtame != '\0') && ((*(uint *)&mtmp->field_0x60 >> 0x1a & 1) == 0)) &&
     ((mtmp->data->mflags1 & 0x60000000) != 0)) {
    iVar6 = *(int *)((long)&mtmp[1].data + 4);
    uVar2 = iVar6 + 0x2ee;
    if (iVar6 + 500U < moves) {
      if ((moves <= uVar2) && (2 < mtmp->mhp)) goto LAB_00172bc0;
    }
    else if (moves <= uVar2) goto LAB_00172bc0;
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfbbfffff;
    mtmp->mtame = '\0';
  }
LAB_00172bc0:
  if ((mtmp->mtame == '\0') && ((mtmp->field_0x63 & 1) != 0)) {
    impossible("catching up for leashed monster?");
    m_unleash(mtmp,'\0');
  }
  iVar6 = iVar7 / 0x14;
  if ((mtmp->data->mflags1 >> 0x17 & 1) != 0) {
    iVar6 = iVar7;
  }
  iVar6 = iVar6 + mtmp->mhp;
  if (mtmp->mhpmax <= iVar6) {
    iVar6 = mtmp->mhpmax;
  }
  mtmp->mhp = iVar6;
  return;
}

Assistant:

void mon_catchup_elapsed_time(struct monst *mtmp, long nmv)
{
	int imv = 0;	/* avoid zillions of casts and lint warnings */

	if (nmv >= LARGEST_INT)		/* paranoia */
	    imv = LARGEST_INT - 1;
	else
	    imv = (int)nmv;

	/* might stop being afraid, blind or frozen */
	/* set to 1 and allow final decrement in movemon() */
	if (mtmp->mblinded) {
	    if (imv >= (int) mtmp->mblinded) mtmp->mblinded = 1;
	    else mtmp->mblinded -= imv;
	}
	if (mtmp->mfrozen) {
	    if (imv >= (int) mtmp->mfrozen) mtmp->mfrozen = 1;
	    else mtmp->mfrozen -= imv;
	}
	if (mtmp->mfleetim) {
	    if (imv >= (int) mtmp->mfleetim) mtmp->mfleetim = 1;
	    else mtmp->mfleetim -= imv;
	}

	/* might recover from temporary trouble */
	if (mtmp->mtrapped && rn2(imv + 1) > 40/2) mtmp->mtrapped = 0;
	if (mtmp->mconf    && rn2(imv + 1) > 50/2) mtmp->mconf = 0;
	if (mtmp->mstun    && rn2(imv + 1) > 10/2) mtmp->mstun = 0;

	/* might finish eating or be able to use special ability again */
	if (imv > mtmp->meating) mtmp->meating = 0;
	else mtmp->meating -= imv;
	if (imv > mtmp->mspec_used) mtmp->mspec_used = 0;
	else mtmp->mspec_used -= imv;

	/* reduce tameness for every 150 moves you are separated */
	if (mtmp->mtame) {
	    int wilder = (imv + 75) / 150;
	    if (mtmp->mtame > wilder) mtmp->mtame -= wilder;	/* less tame */
	    else if (mtmp->mtame > rn2(wilder)) mtmp->mtame = 0;  /* untame */
	    else mtmp->mtame = mtmp->mpeaceful = 0;		/* hostile! */
	}
	/* check to see if it would have died as a pet; if so, go wild instead
	 * of dying the next time we call dog_move()
	 */
	if (mtmp->mtame && !mtmp->isminion &&
			(carnivorous(mtmp->data) || herbivorous(mtmp->data))) {
	    struct edog *edog = EDOG(mtmp);

	    if ((moves > edog->hungrytime + 500 && mtmp->mhp < 3) ||
		    (moves > edog->hungrytime + 750))
		mtmp->mtame = mtmp->mpeaceful = 0;
	}

	if (!mtmp->mtame && mtmp->mleashed) {
	    /* leashed monsters should always be with hero, consequently
	       never losing any time to be accounted for later */
	    impossible("catching up for leashed monster?");
	    m_unleash(mtmp, FALSE);
	}

	/* recover lost hit points */
	if (!regenerates(mtmp->data)) imv /= 20;
	if (mtmp->mhp + imv >= mtmp->mhpmax)
	    mtmp->mhp = mtmp->mhpmax;
	else mtmp->mhp += imv;
}